

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_widget.h
# Opt level: O0

void __thiscall nesvis::MemoryWidget::draw(MemoryWidget *this)

{
  bool bVar1;
  anon_class_8_1_8991fb9c local_c0;
  function<unsigned_char_(unsigned_short)> local_b8;
  allocator<char> local_91;
  string local_90;
  anon_class_8_1_8991fb9c local_70;
  function<unsigned_char_(unsigned_short)> local_68;
  allocator<char> local_31;
  string local_30;
  MemoryWidget *local_10;
  MemoryWidget *this_local;
  
  local_10 = this;
  ImGui::Begin("Memory viewer",(bool *)0x0,0);
  ImGui::BeginTabBar("##tabs",0);
  bVar1 = ImGui::BeginTabItem("Cpu",(bool *)0x0,0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"Cpu",&local_31);
    local_70.this = this;
    std::function<unsigned_char(unsigned_short)>::
    function<nesvis::MemoryWidget::draw()::_lambda(unsigned_short)_1_,void>
              ((function<unsigned_char(unsigned_short)> *)&local_68,&local_70);
    draw_tab(this,&local_30,&this->cpu_mem_labels_,0xffff,&local_68);
    std::function<unsigned_char_(unsigned_short)>::~function(&local_68);
    std::__cxx11::string::~string((string *)&local_30);
    std::allocator<char>::~allocator(&local_31);
    ImGui::EndTabItem();
  }
  bVar1 = ImGui::BeginTabItem("Ppu",(bool *)0x0,0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"Ppu",&local_91);
    local_c0.this = this;
    std::function<unsigned_char(unsigned_short)>::
    function<nesvis::MemoryWidget::draw()::_lambda(unsigned_short)_2_,void>
              ((function<unsigned_char(unsigned_short)> *)&local_b8,&local_c0);
    draw_tab(this,&local_90,&this->ppu_mem_lables_,0x4000,&local_b8);
    std::function<unsigned_char_(unsigned_short)>::~function(&local_b8);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
    ImGui::EndTabItem();
  }
  ImGui::EndTabBar();
  ImGui::End();
  return;
}

Assistant:

void draw() {
        ImGui::Begin("Memory viewer", nullptr);

        ImGui::BeginTabBar("##tabs", ImGuiTabBarFlags_None);

        if (ImGui::BeginTabItem("Cpu")) {
            draw_tab("Cpu",
                    cpu_mem_labels_,
                    0xFFFF,
                    [this](uint16_t address) -> uint8_t {
                        return nes_->mmu().read_byte(address);
                    });
            ImGui::EndTabItem();
        }
        if (ImGui::BeginTabItem("Ppu")) {
            draw_tab("Ppu",
                    ppu_mem_lables_,
                    0x4000,
                    [this](uint16_t address) -> uint8_t {
                        return nes_->ppu_mmu().read_byte(address);
                    });
            ImGui::EndTabItem();
        }

        ImGui::EndTabBar();
        ImGui::End();
    }